

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_generate_op(sexp ctx,sexp self,sexp_sint_t n,sexp ast,sexp env)

{
  sexp psVar1;
  sexp bc;
  sexp in_RDI;
  sexp in_R8;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp res;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp vec;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp ctx2;
  sexp in_stack_ffffffffffffff78;
  sexp in_stack_ffffffffffffff80;
  sexp in_stack_ffffffffffffff88;
  sexp_conflict lam;
  sexp_gc_var_t *in_stack_ffffffffffffff90;
  sexp_conflict loc;
  sexp_conflict self_00;
  undefined8 in_stack_ffffffffffffffa0;
  undefined8 ctx_00;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 n_00;
  undefined8 stack;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 x;
  undefined8 ctx_01;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_10;
  
  local_38 = 0x43e;
  local_30 = in_R8;
  local_10 = in_RDI;
  memset(&stack0xffffffffffffffb8,0,0x10);
  stack = &DAT_0000043e;
  memset(&stack0xffffffffffffffa0,0,0x10);
  self_00 = (sexp_conflict)&DAT_0000043e;
  memset(&stack0xffffffffffffff88,0,0x10);
  if (((local_30 & 3) == 0) && (((sexp)local_30)->tag == 0x24)) {
    local_38 = local_30;
  }
  else {
    if (((local_30 & 3) != 0) || (((sexp)local_30)->tag != 0x17)) {
      psVar1 = sexp_type_exception((sexp)in_stack_ffffffffffffffa0,self_00,
                                   (sexp_uint_t)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88)
      ;
      return psVar1;
    }
    local_38 = sexp_make_eval_context
                         ((sexp)in_stack_ffffffffffffffb8,(sexp)stack,
                          (sexp)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                          (sexp_uint_t)self_00);
  }
  x = &stack0xffffffffffffffc8;
  ctx_01 = (((sexp)local_10)->value).context.saves;
  (((sexp)local_10)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffb8;
  ctx_00 = &stack0xffffffffffffffb0;
  n_00 = (((sexp)local_10)->value).context.saves;
  (((sexp)local_10)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffa0;
  lam = (sexp_conflict)&stack0xffffffffffffff98;
  loc = (sexp_conflict)(((sexp)local_10)->value).context.saves;
  (((sexp)local_10)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffff88;
  sexp_free_vars((sexp)ctx_01,(sexp)x,(sexp)stack);
  sexp_generate((sexp_conflict)ctx_00,self_00,loc,lam,in_stack_ffffffffffffff80);
  psVar1 = sexp_complete_bytecode(in_stack_ffffffffffffff78);
  if ((((ulong)psVar1 & 3) != 0) || (bc = psVar1, psVar1->tag != 0x13)) {
    (((sexp)local_38)->value).port.size = 0x3e;
    bc = sexp_make_vector_op((sexp)x,(sexp)stack,n_00,(sexp)ctx_00,psVar1);
    if ((((ulong)bc & 3) != 0) || (bc->tag != 0x13)) {
      bc = sexp_make_procedure_op
                     ((sexp)ctx_00,psVar1,(sexp_sint_t)loc,lam,in_stack_ffffffffffffff80,bc,bc);
    }
  }
  (((sexp)local_10)->value).context.saves = (sexp_gc_var_t *)ctx_01;
  return bc;
}

Assistant:

sexp sexp_generate_op (sexp ctx, sexp self, sexp_sint_t n, sexp ast, sexp env) {
  sexp_gc_var3(ctx2, vec, res);
  if (sexp_contextp(env)) {
    ctx2 = env;
  } else {
    sexp_assert_type(ctx, sexp_envp, SEXP_ENV, env);
    ctx2 = sexp_make_eval_context(ctx, NULL, env, 0, 0);
  }
  sexp_gc_preserve3(ctx, ctx2, vec, res);
  sexp_free_vars(ctx2, ast, SEXP_NULL);    /* should return SEXP_NULL */
  sexp_emit_enter(ctx2);
  sexp_generate(ctx2, 0, 0, 0, ast);
  res = sexp_complete_bytecode(ctx2);
  if (!sexp_exceptionp(res)) {
    sexp_context_specific(ctx2) = SEXP_FALSE;
    vec = sexp_make_vector(ctx2, 0, SEXP_VOID);
    if (sexp_exceptionp(vec)) res = vec;
    else res = sexp_make_procedure(ctx2, SEXP_ZERO, SEXP_ZERO, res, vec);
  }
  sexp_gc_release3(ctx);
  return res;
}